

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O0

void __thiscall sptk::SymmetricMatrix::Resize(SymmetricMatrix *this,int num_dimension)

{
  reference pvVar1;
  reference ppdVar2;
  int in_ESI;
  long in_RDI;
  int j;
  int i;
  int local_24;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar3;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  local_24 = in_ESI;
  if (in_ESI < 0) {
    local_24 = 0;
  }
  *(int *)(in_RDI + 8) = local_24;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  std::vector<double_*,_std::allocator<double_*>_>::resize
            ((vector<double_*,_std::allocator<double_*>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar4 = 0;
  iVar3 = 0;
  while (iVar4 < *(int *)(in_RDI + 8)) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)iVar3);
    ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),(long)iVar4)
    ;
    *ppdVar2 = pvVar1;
    iVar4 = iVar4 + 1;
    iVar3 = iVar4 + iVar3;
  }
  return;
}

Assistant:

void SymmetricMatrix::Resize(int num_dimension) {
  num_dimension_ = num_dimension < 0 ? 0 : num_dimension;
  data_.resize(num_dimension_ * (num_dimension_ + 1) / 2);
  index_.resize(num_dimension_);

  for (int i(0), j(0); i < num_dimension_; ++i, j += i) {
    index_[i] = &data_[j];
  }
}